

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O3

int __thiscall
SocketInternals::Send
          (SocketInternals *this,uchar *bufsend,size_t msglen,EthDestType destType,uchar ip_offset)

{
  in_addr_t iVar1;
  ssize_t sVar2;
  int *piVar3;
  size_t sVar4;
  char *__s;
  int iVar5;
  sockaddr *__addr;
  ostream *poVar6;
  
  if (destType == DEST_MULTICAST) {
    iVar5 = this->SocketFD;
    __addr = (sockaddr *)&this->ServerAddrMulticast;
LAB_00111e91:
    sVar2 = sendto(iVar5,bufsend,msglen,0,__addr,0x10);
    iVar5 = (int)sVar2;
  }
  else {
    if (destType == DEST_BROADCAST) {
      iVar5 = this->SocketFD;
      __addr = (sockaddr *)&this->ServerAddrBroadcast;
      goto LAB_00111e91;
    }
    iVar1 = (this->ServerAddr).sin_addr.s_addr;
    if (ip_offset != '\0') {
      (this->ServerAddr).sin_addr.s_addr = (uint)ip_offset * 0x1000000 + iVar1;
    }
    sVar2 = sendto(this->SocketFD,bufsend,msglen,0,(sockaddr *)&this->ServerAddr,0x10);
    iVar5 = (int)sVar2;
    (this->ServerAddr).sin_addr.s_addr = iVar1;
  }
  if (iVar5 == -1) {
    poVar6 = this->outStr;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Send: failed to send: ",0x16);
    piVar3 = __errno_location();
    __s = strerror(*piVar3);
    if (__s == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
      goto LAB_00111f5b;
    }
    sVar4 = strlen(__s);
  }
  else {
    if (iVar5 == (int)msglen) {
      return iVar5;
    }
    poVar6 = this->outStr;
    __s = "Send: failed to send the whole message";
    sVar4 = 0x26;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,__s,sVar4);
LAB_00111f5b:
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  return iVar5;
}

Assistant:

int SocketInternals::Send(const unsigned char *bufsend, size_t msglen, EthDestType destType, unsigned char ip_offset)
{
    int retval;
    if (destType == DEST_BROADCAST) {
        retval = sendto(SocketFD, reinterpret_cast<const char *>(bufsend), msglen, 0,
                        reinterpret_cast<struct sockaddr *>(&ServerAddrBroadcast), sizeof(ServerAddrBroadcast));
    }
    else if (destType == DEST_MULTICAST) {
        retval = sendto(SocketFD, reinterpret_cast<const char *>(bufsend), msglen, 0,
                        reinterpret_cast<struct sockaddr *>(&ServerAddrMulticast), sizeof(ServerAddrMulticast));
    }
    else {
        // Save base address (e.g., 169.254.0.100)
        uint32_t s_addr_saved = ServerAddr.sin_addr.s_addr;
        // Update IP address if needed (Firmware Rev 9+)
        if (ip_offset > 0)
            ServerAddr.sin_addr.s_addr += (ip_offset<<24);
        retval = sendto(SocketFD, reinterpret_cast<const char *>(bufsend), msglen, 0,
                        reinterpret_cast<struct sockaddr *>(&ServerAddr), sizeof(ServerAddr));
        // Restore base address
        ServerAddr.sin_addr.s_addr = s_addr_saved;
    }

    if (retval == SOCKET_ERROR) {
#ifdef _MSC_VER
        outStr << "Send: failed to send: " << WSAGetLastError() << std::endl;
#else
        outStr << "Send: failed to send: " << strerror(errno) << std::endl;
#endif
        return -1;
    }
    else if (retval != static_cast<int>(msglen)) {
        outStr << "Send: failed to send the whole message" << std::endl;
    }
    return retval;
}